

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O3

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,ScalarFunction *function)

{
  LogicalType *this_00;
  _Manager_type p_Var1;
  long lVar2;
  bind_scalar_function_t *pp_Var3;
  bind_scalar_function_t *pp_Var4;
  byte bVar5;
  CreateScalarFunctionInfo info;
  ScalarFunction local_310;
  CreateScalarFunctionInfo local_1e8;
  
  bVar5 = 0;
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_310,(SimpleFunction *)function);
  local_310.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  this_00 = &local_310.super_BaseScalarFunction.return_type;
  LogicalType::LogicalType(this_00,&(function->super_BaseScalarFunction).return_type);
  local_310.super_BaseScalarFunction.stability = (function->super_BaseScalarFunction).stability;
  local_310.super_BaseScalarFunction.null_handling =
       (function->super_BaseScalarFunction).null_handling;
  local_310.super_BaseScalarFunction.errors = (function->super_BaseScalarFunction).errors;
  local_310.super_BaseScalarFunction.collation_handling =
       (function->super_BaseScalarFunction).collation_handling;
  local_310.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  local_310.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_310.function.super__Function_base._M_functor._8_8_ = 0;
  local_310.function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_310.function._M_invoker = (function->function)._M_invoker;
  p_Var1 = (function->function).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_310.function.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(function->function).super__Function_base._M_functor;
    local_310.function.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(function->function).super__Function_base._M_functor + 8);
    (function->function).super__Function_base._M_manager = (_Manager_type)0x0;
    (function->function)._M_invoker = (_Invoker_type)0x0;
    local_310.function.super__Function_base._M_manager = p_Var1;
  }
  pp_Var3 = &function->bind;
  pp_Var4 = &local_310.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_310.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_310.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1e8,&local_310);
  local_310.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_310.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_310.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_310.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_310.function.super__Function_base._M_manager)
              ((_Any_data *)&local_310.function,(_Any_data *)&local_310.function,__destroy_functor);
  }
  local_310.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::~LogicalType(this_00);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_310);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1e8.super_CreateFunctionInfo);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateScalarFunctionInfo_01981320;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_1e8.functions.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p !=
      &local_1e8.functions.super_FunctionSet<duckdb::ScalarFunction>.name.field_2) {
    operator_delete(local_1e8.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus.
                    _M_p);
  }
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_01966ba0;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1e8.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1e8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(ScalarFunction function) {
	CreateScalarFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}